

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O1

void dw3_female_sage(dw_rom *rom)

{
  vpatch(rom,0x87da,2,0xe,0x1b);
  vpatch(rom,0x13b4,0x4f,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,
         0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,
         0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50);
  vpatch(rom,0x14b4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14d4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14f4,0xd,0x48,0,0xa9,3,0x4a,0,0xab,3,0x4c,0,0xad,3,0x4e);
  vpatch(rom,0x15b4,0x43,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,
         0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,
         0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0xb4);
  vpatch(rom,0x15fe,1,0x35);
  vpatch(rom,0x16b4,0x43,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,
         0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,
         0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0xb8);
  vpatch(rom,0x16fe,1,0x45);
  vpatch(rom,0x1705,3,0,0x39,0);
  vpatch(rom,0x1a8b,3,0x36,0x30,0x11);
  vpatch(rom,0x12300,0x7f,3,0xf,0x1e,0x1d,0x11,0xaf,0x7f,0x3f,3,0xf,0x1f,0x1f,0x1f,0xba,0x72,0x38,
         0xc0,0xf0,0x78,0xb8,0x88,0xf0,0xf8,0xf8,0xc0,0xf0,0xf8,0xf9,0xff,0x5a,0x4a,0x1a,0x7e,0xff,
         0xb0,0x78,0x77,0x40,0xf,0xf,0x77,0xe3,0x8f,0x1f,0x78,0x5f,0,0xf,0x78,0xfe,0xe,0x1c,0xec,4,
         0x70,0,0xe2,0xc0,0xf8,0xfe,0x1e,0xfe,0x72,2,3);
  vpatch(rom,0x12400,0x180,7,0xf,7,0xb,0,7,7,7,7,0xf,0xf,0x1f,0x1f,0xc,0xc,8,0xe0,0xf0,0xf0,0xf8,
         0x7a,0x9c,0xec,0xfe,0xe0,0xf0,0xf0,0xf8,0xfa,0xfc,0x3c,0x7e,1,7,0xf,0xc,7,0,1,3,0xb,0xe,0,3
         ,8,0xf,8,0xb,0x9f,0x1d,0x8a,0x80,0xc0,0x44,0xf8,0xe0,0xff,0xfd,0xfa,0xf8,0x7c,0xfc,0x38,
         0xe0,7);
  return;
}

Assistant:

static void dw3_female_sage(dw_rom *rom)
{
    vpatch(rom, 0x087da,    2,  0x0e,  0x1b); // his -> her
    vpatch(rom, 0x013b4,   79,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57);
    vpatch(rom, 0x014b4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014d4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014f4,   13,  0x48,  0x00,  0xa9,  0x03,  0x4a,  0x00,  0xab,  0x03,  0x4c,  0x00,  0xad,  0x03,  0x4e);
    vpatch(rom, 0x015b4,   67,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0xb4,  0x03,  0x31);
    vpatch(rom, 0x015fe,    1,  0x35);
    vpatch(rom, 0x016b4,   67,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0xb8,  0x03,  0x41);
    vpatch(rom, 0x016fe,    1,  0x45);
    vpatch(rom, 0x01705,    3,  0x00,  0x39,  0x00);
    vpatch(rom, 0x01a8b,    3,  0x36,  0x30,  0x11);
    vpatch(rom, 0x12300,  127,  0x03,  0x0f,  0x1e,  0x1d,  0x11,  0xaf,  0x7f,  0x3f,  0x03,  0x0f,  0x1f,  0x1f,  0x1f,  0xba,  0x72,  0x38,  0xc0,  0xf0,  0x78,  0xb8,  0x88,  0xf0,  0xf8,  0xf8,  0xc0,  0xf0,  0xf8,  0xf9,  0xff,  0x5a,  0x4a,  0x1a,  0x7e,  0xff,  0xb0,  0x78,  0x77,  0x40,  0x0f,  0x0f,  0x77,  0xe3,  0x8f,  0x1f,  0x78,  0x5f,  0x00,  0x0f,  0x78,  0xfe,  0x0e,  0x1c,  0xec,  0x04,  0x70,  0x00,  0xe2,  0xc0,  0xf8,  0xfe,  0x1e,  0xfe,  0x72,  0x02,  0x03,  0x0f,  0x1e,  0x1d,  0x11,  0xaf,  0x7f,  0x3f,  0x03,  0x0f,  0x1f,  0x1f,  0x1f,  0xba,  0x72,  0x38,  0xc0,  0xf0,  0x78,  0xb8,  0x88,  0xf0,  0xf8,  0xf8,  0xc0,  0xf0,  0xf8,  0xf8,  0xf8,  0x59,  0x4f,  0x1a,  0x7e,  0xdf,  0xb0,  0x38,  0x77,  0x40,  0x0e,  0x00,  0x77,  0xc3,  0x8f,  0x27,  0x78,  0x5f,  0x0e,  0x00,  0x78,  0xf8,  0x0e,  0x1e,  0xec,  0x04,  0xf0,  0xf0,  0xea,  0xc2,  0xf0,  0xf8,  0x1e,  0xfe,  0x02);
    vpatch(rom, 0x12400,  384,  0x07,  0x0f,  0x07,  0x0b,  0x00,  0x07,  0x07,  0x07,  0x07,  0x0f,  0x0f,  0x1f,  0x1f,  0x0c,  0x0c,  0x08,  0xe0,  0xf0,  0xf0,  0xf8,  0x7a,  0x9c,  0xec,  0xfe,  0xe0,  0xf0,  0xf0,  0xf8,  0xfa,  0xfc,  0x3c,  0x7e,  0x01,  0x07,  0x0f,  0x0c,  0x07,  0x00,  0x01,  0x03,  0x0b,  0x0e,  0x00,  0x03,  0x08,  0x0f,  0x08,  0x0b,  0x9f,  0x1d,  0x8a,  0x80,  0xc0,  0x44,  0xf8,  0xe0,  0xff,  0xfd,  0xfa,  0xf8,  0x7c,  0xfc,  0x38,  0xe0,  0x07,  0x0f,  0x07,  0x0b,  0x08,  0x0f,  0x0f,  0x07,  0x07,  0x0f,  0x0f,  0x0f,  0x0f,  0x04,  0x34,  0x60,  0xe0,  0xf0,  0xf0,  0xf8,  0x7a,  0x9c,  0xec,  0xfe,  0xe0,  0xf0,  0xf0,  0xf8,  0xfa,  0xfc,  0x3c,  0x7e,  0x01,  0x07,  0x03,  0x0e,  0x07,  0x00,  0x07,  0x0f,  0x13,  0x0e,  0x0c,  0x01,  0x00,  0x0f,  0x00,  0x0f,  0x9f,  0x1d,  0x8a,  0x80,  0xc0,  0x44,  0xb8,  0x80,  0xff,  0xfd,  0xfa,  0xf8,  0x7c,  0xfc,  0x78,  0x80,  0x07,  0x0f,  0x0f,  0x1f,  0x5e,  0x39,  0x37,  0x7f,  0x07,  0x0f,  0x0f,  0x1f,  0x5f,  0x3f,  0x3c,  0x7e,  0xe0,  0xf0,  0xe0,  0xd0,  0x10,  0xf0,  0xf0,  0xe0,  0xe0,  0xf0,  0xf0,  0xf0,  0xf0,  0x20,  0x2c,  0x06,  0xf9,  0xb9,  0x53,  0x02,  0x07,  0x44,  0x3f,  0x0f,  0xff,  0xbe,  0x5e,  0x3f,  0x7c,  0x7f,  0x38,  0x0f,  0x80,  0xe0,  0x80,  0xe0,  0xc0,  0x00,  0x80,  0xc0,  0xc8,  0x70,  0x60,  0x00,  0x00,  0xe0,  0x00,  0xc0,  0x07,  0x0f,  0x0f,  0x1f,  0x5e,  0x39,  0x37,  0x7f,  0x07,  0x0f,  0x0f,  0x1f,  0x5f,  0x3f,  0x3c,  0x7e,  0xe0,  0xf0,  0xe0,  0xd0,  0x10,  0xf0,  0xf0,  0xe0,  0xe0,  0xf0,  0xf0,  0xf4,  0xfc,  0x28,  0x28,  0x08,  0xf9,  0xb9,  0x53,  0x07,  0x07,  0x22,  0x1f,  0x03,  0xff,  0xbe,  0x5c,  0x18,  0x38,  0x3f,  0x1c,  0x03,  0x80,  0xf0,  0x18,  0x08,  0xc0,  0x00,  0xc0,  0xe0,  0xc8,  0x68,  0xe0,  0xe0,  0x08,  0xe8,  0x08,  0xe8,  0x03,  0x0f,  0x1f,  0x1f,  0x1f,  0x07,  0x18,  0x1f,  0x03,  0x0f,  0x1f,  0x9f,  0xff,  0x5f,  0x5f,  0x5f,  0xc0,  0xf0,  0xf8,  0xf8,  0xf8,  0xe5,  0x1e,  0xfc,  0xc0,  0xf0,  0xf8,  0xf8,  0xf8,  0xfd,  0xfe,  0xfc,  0x1f,  0x7f,  0x67,  0x03,  0x00,  0x20,  0x13,  0x00,  0x5f,  0x0f,  0x1f,  0x7f,  0x7f,  0x7f,  0x5f,  0x40,  0xfe,  0xff,  0x6d,  0xb4,  0x00,  0xf0,  0xf8,  0xf0,  0xfe,  0xff,  0xfd,  0xfc,  0xfe,  0xfe,  0x0c,  0xf0,  0x03,  0x0f,  0x1f,  0x1f,  0x1f,  0x07,  0x18,  0x1f,  0x03,  0x0f,  0x1f,  0x1f,  0x1f,  0x1f,  0xff,  0x5f,  0xc0,  0xf0,  0xf8,  0xf8,  0xf8,  0xe5,  0x1e,  0xfc,  0xc0,  0xf0,  0xf8,  0xf8,  0xf8,  0xfd,  0xfe,  0xfc,  0x1f,  0x0f,  0x47,  0x43,  0x00,  0x0f,  0x1f,  0x0f,  0x5f,  0x5f,  0x3f,  0x3f,  0x7f,  0x7f,  0x30,  0x0f,  0xfe,  0xff,  0x6d,  0xb4,  0x00,  0x02,  0xc4,  0x00,  0xfe,  0xff,  0xfd,  0xfc,  0xfe,  0xfe,  0xfc,  0x00);
}